

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O1

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *local_48;
  int *piStack_40;
  size_t local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  size_t local_20;
  
  if (this->c == 0) {
    if (this->h == 0) {
      if (this->w == 0) {
        if ((((this->data).dims != 1) || ((this->data).w != 1)) || ((this->data).elemsize != 4)) {
          piVar2 = (this->data).refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if ((*piVar2 == 0) && (pvVar4 = (this->data).data, pvVar4 != (void *)0x0)) {
              free(*(void **)((long)pvVar4 + -8));
            }
          }
          (this->data).h = 0;
          (this->data).c = 0;
          (this->data).cstep = 0;
          (this->data).elemsize = 0;
          (this->data).dims = 0;
          (this->data).w = 0;
          (this->data).data = (void *)0x0;
          (this->data).refcount = (int *)0x0;
          (this->data).elemsize = 4;
          (this->data).dims = 1;
          (this->data).w = 1;
          (this->data).h = 1;
          (this->data).c = 1;
          (this->data).cstep = 1;
          pvVar4 = malloc(0x20);
          pvVar5 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar5 - 8) = pvVar4;
          (this->data).data = pvVar5;
          (this->data).refcount = (int *)((long)pvVar5 + 4);
          *(undefined4 *)((long)pvVar5 + 4) = 1;
        }
        goto LAB_001104aa;
      }
      (**mb->_vptr_ModelBin)(&local_48);
    }
    else {
      (*mb->_vptr_ModelBin[1])(&local_48,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,1);
    }
  }
  else {
    (*mb->_vptr_ModelBin[2])
              (&local_48,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,(ulong)(uint)this->c,1);
  }
  pMVar1 = &this->data;
  if (pMVar1 != (Mat *)&local_48) {
    if (piStack_40 != (int *)0x0) {
      LOCK();
      *piStack_40 = *piStack_40 + 1;
      UNLOCK();
    }
    piVar2 = (this->data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (pMVar1->data != (void *)0x0)) {
        free(*(void **)((long)pMVar1->data + -8));
      }
    }
    (this->data).h = 0;
    (this->data).c = 0;
    (this->data).cstep = 0;
    (this->data).elemsize = 0;
    (this->data).dims = 0;
    (this->data).w = 0;
    pMVar1->data = (void *)0x0;
    (this->data).refcount = (int *)0x0;
    (this->data).data = local_48;
    (this->data).refcount = piStack_40;
    (this->data).elemsize = local_38;
    (this->data).dims = (undefined4)local_30;
    (this->data).w = local_30._4_4_;
    (this->data).h = (undefined4)uStack_28;
    (this->data).c = uStack_28._4_4_;
    (this->data).cstep = local_20;
  }
  if (piStack_40 != (int *)0x0) {
    LOCK();
    *piStack_40 = *piStack_40 + -1;
    UNLOCK();
    if ((*piStack_40 == 0) && (local_48 != (void *)0x0)) {
      free(*(void **)((long)local_48 + -8));
    }
  }
LAB_001104aa:
  if ((this->data).data == (void *)0x0) {
    iVar3 = -100;
  }
  else {
    iVar3 = -100;
    if ((long)(this->data).c * (this->data).cstep != 0) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (c != 0)
    {
        data = mb.load(w, h, c, 1);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, 1);
    }
    else if (w != 0)
    {
        data = mb.load(w, 1);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}